

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,
          BindSparseResourceMemoryAttribs *Attribs,int param_2)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  RenderDeviceVkImpl *pRVar4;
  RenderDeviceInfo *pRVar5;
  RenderPassVkImpl *pRVar6;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  undefined1 local_130 [8];
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  BindSparseResourceMemoryAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_40,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"BindSparseResourceMemory",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x86e);
      std::__cxx11::string::~string((string *)local_40);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x86e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_SPARSE_BINDING);
  if (CVar2 != COMMAND_QUEUE_TYPE_SPARSE_BINDING) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[25],char[22],std::__cxx11::string,char[8]>
              ((string *)local_90,(Diligent *)"BindSparseResourceMemory",(char (*) [25])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x86e);
    std::__cxx11::string::~string((string *)local_90);
  }
  bVar1 = IsDeferred(this);
  if (bVar1) {
    FormatString<char[73]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [73])
               "BindSparseResourceMemory() should only be called for immediate contexts.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x870);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
  pRVar5 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar4);
  if ((pRVar5->Features).SparseResources == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[82]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [82])
               "IDeviceContext::BindSparseResourceMemory: SparseResources feature must be enabled");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x871);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar6 != (RenderPassVkImpl *)0x0) {
    FormatString<char[57]>
              ((string *)((long)&msg_6.field_2 + 8),
               (char (*) [57])"Can not bind sparse memory inside an active render pass.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x872);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                     ((RefCntAutoPtr *)&this->m_pDevice);
  bVar1 = VerifyBindSparseResourceMemoryAttribs((IRenderDevice *)pRVar4,Attribs);
  if (!bVar1) {
    FormatString<char[44]>
              ((string *)local_130,(char (*) [44])"BindSparseResourceMemoryAttribs are invalid");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x873);
    std::__cxx11::string::~string((string *)local_130);
  }
  (this->m_Stats).CommandCounters.BindSparseResourceMemory =
       (this->m_Stats).CommandCounters.BindSparseResourceMemory + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_SPARSE_BINDING, "BindSparseResourceMemory");

    DEV_CHECK_ERR(!IsDeferred(), "BindSparseResourceMemory() should only be called for immediate contexts.");
    DEV_CHECK_ERR(m_pDevice->GetDeviceInfo().Features.SparseResources, "IDeviceContext::BindSparseResourceMemory: SparseResources feature must be enabled");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Can not bind sparse memory inside an active render pass.");
    DEV_CHECK_ERR(VerifyBindSparseResourceMemoryAttribs(m_pDevice, Attribs), "BindSparseResourceMemoryAttribs are invalid");

    ++m_Stats.CommandCounters.BindSparseResourceMemory;
}